

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfa.cc
# Opt level: O1

void __thiscall re2::NFA::NFA(NFA *this,Prog *prog)

{
  long lVar1;
  int iVar2;
  Prog *pPVar3;
  AddState *pAVar4;
  AddState *pAVar5;
  ulong uVar6;
  long lVar7;
  
  (this->q1_).dense_.
  super__Vector_base<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_std::allocator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->q1_).dense_.
  super__Vector_base<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_std::allocator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->q1_).sparse_to_dense_ = (int *)0x0;
  (this->q1_).dense_.
  super__Vector_base<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_std::allocator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->q0_).dense_.
  super__Vector_base<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_std::allocator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->q1_).size_ = 0;
  (this->q1_).max_size_ = 0;
  (this->q0_).dense_.
  super__Vector_base<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_std::allocator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->q0_).dense_.
  super__Vector_base<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_std::allocator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->q0_).size_ = 0;
  (this->q0_).max_size_ = 0;
  (this->q0_).sparse_to_dense_ = (int *)0x0;
  this->prog_ = prog;
  this->start_ = prog->start_;
  this->ncapture_ = 0;
  this->longest_ = false;
  this->endmatch_ = false;
  this->btext_ = (char *)0x0;
  this->etext_ = (char *)0x0;
  SparseArray<re2::NFA::Thread_*>::resize(&this->q0_,prog->size_);
  SparseArray<re2::NFA::Thread_*>::resize(&this->q1_,this->prog_->size_);
  pPVar3 = this->prog_;
  lVar1 = (long)pPVar3->inst_count_[4] + (long)pPVar3->inst_count_[3] * 2;
  iVar2 = pPVar3->inst_count_[6];
  lVar7 = iVar2 + lVar1 + 1;
  this->nastack_ = (int)lVar7;
  uVar6 = 0xffffffffffffffff;
  if (-2 < (int)lVar1 + iVar2) {
    uVar6 = lVar7 * 0x10;
  }
  pAVar4 = (AddState *)operator_new__(uVar6);
  if ((int)lVar7 != 0) {
    pAVar5 = pAVar4;
    do {
      pAVar5->id = 0;
      pAVar5->t = (Thread *)0x0;
      pAVar5 = pAVar5 + 1;
    } while (pAVar5 != pAVar4 + lVar7);
  }
  this->astack_ = pAVar4;
  this->match_ = (char **)0x0;
  this->matched_ = false;
  this->free_threads_ = (Thread *)0x0;
  return;
}

Assistant:

NFA::NFA(Prog* prog) {
  prog_ = prog;
  start_ = prog_->start();
  ncapture_ = 0;
  longest_ = false;
  endmatch_ = false;
  btext_ = NULL;
  etext_ = NULL;
  q0_.resize(prog_->size());
  q1_.resize(prog_->size());
  // See NFA::AddToThreadq() for why this is so.
  nastack_ = 2*prog_->inst_count(kInstCapture) +
             prog_->inst_count(kInstEmptyWidth) +
             prog_->inst_count(kInstNop) + 1;  // + 1 for start inst
  astack_ = new AddState[nastack_];
  match_ = NULL;
  matched_ = false;
  free_threads_ = NULL;
}